

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

xmlLinkPtr xmlListLinkReverseSearch(xmlListPtr l,void *data)

{
  int iVar1;
  xmlLinkPtr pxVar2;
  xmlLinkPtr pxVar3;
  
  pxVar3 = l->sentinel;
  do {
    pxVar3 = pxVar3->prev;
    if (pxVar3 == l->sentinel) {
      return (xmlLinkPtr)0x0;
    }
    iVar1 = (*l->linkCompare)(pxVar3->data,data);
  } while (0 < iVar1);
  if (pxVar3 == l->sentinel) {
    pxVar2 = (xmlLinkPtr)0x0;
  }
  else {
    iVar1 = (*l->linkCompare)(pxVar3->data,data);
    pxVar2 = (xmlLinkPtr)0x0;
    if (iVar1 == 0) {
      pxVar2 = pxVar3;
    }
  }
  return pxVar2;
}

Assistant:

static xmlLinkPtr
xmlListLinkReverseSearch(xmlListPtr l, void *data)
{
    xmlLinkPtr lk;
    if (l == NULL)
        return(NULL);
    lk = xmlListHigherSearch(l, data);
    if (lk == l->sentinel)
        return NULL;
    else {
        if (l->linkCompare(lk->data, data) ==0)
            return lk;
        return NULL;
    }
}